

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib502.c
# Opt level: O2

int test(char *URL)

{
  uint __i;
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  char *pcVar7;
  undefined8 uVar8;
  timeval tVar9;
  undefined8 uStack_1d0;
  int maxfd;
  int running;
  timeval timeout;
  fd_set fdread;
  fd_set fdexcep;
  fd_set fdwrite;
  
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  uVar8 = _stderr;
  if (iVar1 != 0) {
    uVar2 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar8,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib502.c"
                  ,0x2b,iVar1,uVar2);
    goto LAB_00101392;
  }
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    lVar4 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib502.c"
                  ,0x2d);
    iVar1 = 0x7c;
  }
  else {
    iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
    uVar8 = _stderr;
    if (iVar1 == 0) {
      lVar4 = curl_multi_init();
      if (lVar4 == 0) {
        lVar4 = 0;
        curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib502.c"
                      ,0x31);
        iVar1 = 0x7b;
      }
      else {
        iVar1 = curl_multi_add_handle(lVar4,lVar3);
        uVar8 = _stderr;
        if (iVar1 != 0) {
          uVar2 = curl_multi_strerror(iVar1);
          pcVar7 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
          uStack_1d0 = 0x33;
          goto LAB_00101337;
        }
        do {
          maxfd = -99;
          timeout.tv_sec = 0;
          timeout.tv_usec = 100000;
          iVar1 = curl_multi_perform(lVar4,&running);
          uVar8 = _stderr;
          if (iVar1 != 0) {
            uVar2 = curl_multi_strerror(iVar1);
            pcVar7 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
            uStack_1d0 = 0x3d;
            goto LAB_00101337;
          }
          if (running < 0) {
            pcVar7 = 
            "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
            ;
            uStack_1d0 = 0x3d;
LAB_0010161b:
            curl_mfprintf(_stderr,pcVar7,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib502.c"
                          ,uStack_1d0);
            iVar1 = 0x7a;
            goto LAB_00101372;
          }
          tVar9 = tutil_tvnow();
          lVar5 = tutil_tvdiff(tVar9,tv_test_start);
          if (60000 < lVar5) {
            uStack_1d0 = 0x3f;
            goto LAB_001015c3;
          }
          if (running == 0) {
            iVar1 = 0;
            goto LAB_00101372;
          }
          for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
            fdread.__fds_bits[lVar5] = 0;
          }
          for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
            fdwrite.__fds_bits[lVar5] = 0;
          }
          for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
            fdexcep.__fds_bits[lVar5] = 0;
          }
          iVar1 = curl_multi_fdset(lVar4,&fdread,&fdwrite,&fdexcep,&maxfd);
          uVar8 = _stderr;
          if (iVar1 != 0) {
            uVar2 = curl_multi_strerror(iVar1);
            pcVar7 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
            uStack_1d0 = 0x48;
            goto LAB_00101337;
          }
          if (maxfd < -1) {
            pcVar7 = "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
            uStack_1d0 = 0x48;
            goto LAB_0010161b;
          }
          iVar1 = select_wrapper(maxfd + 1,&fdread,&fdwrite,&fdexcep,&timeout);
          if (iVar1 == -1) {
            piVar6 = __errno_location();
            uVar8 = _stderr;
            iVar1 = *piVar6;
            pcVar7 = strerror(iVar1);
            curl_mfprintf(uVar8,"%s:%d select() failed, with errno %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib502.c"
                          ,0x4c,iVar1,pcVar7);
            iVar1 = 0x79;
            goto LAB_00101372;
          }
          tVar9 = tutil_tvnow();
          lVar5 = tutil_tvdiff(tVar9,tv_test_start);
        } while (lVar5 < 0xea61);
        uStack_1d0 = 0x4e;
LAB_001015c3:
        curl_mfprintf(_stderr,
                      "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib502.c"
                      ,uStack_1d0);
        iVar1 = 0x7d;
      }
    }
    else {
      uVar2 = curl_easy_strerror(iVar1);
      pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar4 = 0;
      uStack_1d0 = 0x2f;
LAB_00101337:
      curl_mfprintf(uVar8,pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]curl/tests/libtest/lib502.c"
                    ,uStack_1d0,iVar1,uVar2);
    }
  }
LAB_00101372:
  curl_multi_remove_handle(lVar4,lVar3);
  curl_multi_cleanup(lVar4);
  curl_easy_cleanup(lVar3);
  curl_global_cleanup();
LAB_00101392:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *c = NULL;
  CURLM *m = NULL;
  int res = 0;
  int running;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(c);

  easy_setopt(c, CURLOPT_URL, URL);

  multi_init(m);

  multi_add_handle(m, c);

  for(;;) {
    struct timeval timeout;
    fd_set fdread, fdwrite, fdexcep;
    int maxfd = -99;

    timeout.tv_sec = 0;
    timeout.tv_usec = 100000L; /* 100 ms */

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(m, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();
  }

test_cleanup:

  /* proper cleanup sequence - type PA */

  curl_multi_remove_handle(m, c);
  curl_multi_cleanup(m);
  curl_easy_cleanup(c);
  curl_global_cleanup();

  return res;
}